

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O1

int trsrch_ddl(custom_function *funcpt,double *xi,double *jac,double *sN,int N,double *dx,
              double maxstep,int iter,double *L,double *hess,double stol,double *ioval,double *x)

{
  size_t __size;
  double *jac_00;
  double *step;
  uint N_00;
  uint uVar1;
  ulong uVar2;
  double dVar3;
  double *hess_00;
  double *dx_00;
  double local_a0;
  double funcprev;
  double local_90;
  double *local_88;
  double *local_80;
  custom_function *local_78;
  double *local_70;
  double local_68;
  double *local_60;
  double *local_58;
  double *local_50;
  double *local_48;
  double local_40;
  uint local_34;
  
  ioval[7] = 1.0;
  __size = (long)N * 8;
  hess_00 = dx;
  local_90 = stol;
  local_88 = jac;
  local_80 = xi;
  local_78 = funcpt;
  local_68 = maxstep;
  local_34 = N;
  local_60 = (double *)malloc(__size);
  local_58 = (double *)malloc(__size);
  local_50 = (double *)malloc(__size);
  local_48 = (double *)malloc(__size);
  local_40 = 0.0;
  if (0 < N) {
    uVar2 = 0;
    do {
      local_40 = local_40 + dx[uVar2] * sN[uVar2] * dx[uVar2] * sN[uVar2];
      uVar2 = uVar2 + 1;
    } while (local_34 != uVar2);
  }
  local_70 = dx;
  if (local_40 < 0.0) {
    local_40 = sqrt(local_40);
  }
  else {
    local_40 = SQRT(local_40);
  }
  N_00 = local_34;
  step = local_60;
  jac_00 = local_88;
  local_a0 = 0.0;
  dVar3 = 1.97626258336499e-323;
  while ((dx_00 = local_70, uVar1 = SUB84(dVar3,0), 0xf < uVar1 ||
         ((0x8003U >> (uVar1 & 0x1f) & 1) == 0))) {
    funcprev = dVar3;
    trstep_ddl(jac_00,sN,N_00,local_70,local_68,L,hess_00,local_40,ioval,local_50,local_48,step);
    uVar1 = trupdate(local_78,local_80,jac_00,step,N_00,dx_00,local_68,SUB84(funcprev,0),L,hess,
                     local_90,1,ioval,local_58,&local_a0,x);
    dVar3 = (double)(ulong)uVar1;
    hess_00 = dx_00;
  }
  free(local_60);
  free(local_58);
  free(local_50);
  free(local_48);
  return uVar1;
}

Assistant:

int trsrch_ddl(custom_function *funcpt,double *xi,double *jac,double *sN,int N,double * dx,double maxstep,
		int iter,double *L,double *hess,double stol,double *ioval,double *x) {
	int retval,i,method;		
	double nlen,funcprev;
	double *temp,*step,*xprev,*ssd,*v;
	/*
	 * ioval[0] = delta; [trust region current radius]
	 * ioval[1] = cauchy step length;
	 * ioval[2]-ioval[5] dummy constants;
	 * ioval[6] and ioval[7] are "binary" flags.
	 */ 
	retval = 4;
	nlen = 0.0;
	ioval[7] = 1.0;
	method = 1;
	temp = (double*) malloc(sizeof(double) *N);
	step = (double*) malloc(sizeof(double) *N);
	xprev = (double*) malloc(sizeof(double) *N);
	ssd = (double*) malloc(sizeof(double) *N);
	v = (double*) malloc(sizeof(double) *N);
	
	for(i = 0; i < N;++i) {
		nlen += dx[i] * sN[i] * dx[i] * sN[i];
	}
	nlen = sqrt(nlen);
	funcprev = 0.0;
	
	while (retval >= 2 && retval != 15) {
		trstep_ddl(jac,sN,N,dx,maxstep,L,hess,nlen,ioval,ssd,v,step);
		retval = trupdate(funcpt,xi,jac,step,N,dx,maxstep,retval,L,hess,stol,method,ioval,xprev,&funcprev,x);
	}
	 
	free(temp); 
	free(step);
	free(xprev);
	free(ssd);
	free(v);
	return retval;

}